

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

float __thiscall
Ptex::v2_2::PtexSeparableKernel::makeSymmetric(PtexSeparableKernel *this,float initialWeight)

{
  int iVar1;
  PtexSeparableKernel *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  int i_2;
  int i_1;
  float scale;
  float sum;
  int i;
  float newWeight;
  float local_34;
  int local_24;
  int local_20;
  int local_14;
  float local_10;
  
  if ((in_RDI->res).vlog2 < (in_RDI->res).ulog2) {
    do {
      downresU(in_RDI);
    } while ((in_RDI->res).vlog2 < (in_RDI->res).ulog2);
  }
  else if ((in_RDI->res).ulog2 < (in_RDI->res).vlog2) {
    do {
      downresV(in_RDI);
    } while ((in_RDI->res).ulog2 < (in_RDI->res).vlog2);
  }
  iVar1 = PtexUtils::min<int>(in_RDI->uw,in_RDI->vw);
  in_RDI->vw = iVar1;
  in_RDI->uw = iVar1;
  local_10 = 0.0;
  for (local_14 = 0; local_14 < in_RDI->uw; local_14 = local_14 + 1) {
    fVar2 = in_RDI->ku[local_14] + in_RDI->kv[local_14];
    in_RDI->kv[local_14] = fVar2;
    in_RDI->ku[local_14] = fVar2;
    local_10 = fVar2 + local_10;
  }
  local_10 = local_10 * local_10;
  if ((local_10 != 0.0) || (NAN(local_10))) {
    local_34 = in_XMM0_Da / local_10;
  }
  else {
    local_34 = 1.0;
  }
  if (local_34 < 1.0) {
    if (-1.0 <= local_34) {
      for (local_24 = 0; local_10 = in_XMM0_Da, local_24 < in_RDI->uw; local_24 = local_24 + 1) {
        in_RDI->ku[local_24] = local_34 * in_RDI->ku[local_24];
      }
    }
    else {
      for (local_20 = 0; local_20 < in_RDI->uw; local_20 = local_20 + 1) {
        in_RDI->ku[local_20] = in_RDI->ku[local_20] * -1.0;
      }
      local_10 = -local_10;
    }
  }
  return local_10;
}

Assistant:

float makeSymmetric(float initialWeight)
    {
        assert(u == 0 && v == 0);

        // downres higher-res dimension until equal
        if (res.ulog2 > res.vlog2) {
            do { downresU(); } while(res.ulog2 > res.vlog2);
        }
        else if (res.vlog2 > res.ulog2) {
            do { downresV(); } while (res.vlog2 > res.ulog2);
        }

        // truncate excess samples in longer dimension
        uw = vw = PtexUtils::min(uw, vw);

        // combine corresponding u and v samples and compute new kernel weight
        float newWeight = 0;
        for (int i = 0; i < uw; i++) {
            float sum = ku[i] + kv[i];
            ku[i] = kv[i] = sum;
            newWeight += sum;
        }
        newWeight *= newWeight; // equivalent to k.weight() ( = sum(ku)*sum(kv) )

        // compute scale factor to compensate for weight change
        float scale = newWeight == 0 ? 1.f : initialWeight / newWeight;

        // Note: a sharpening kernel (like Mitchell) can produce
        // negative weights which may cancel out when adding the two
        // kernel axes together, and this can cause the compensation
        // scale factor to spike up.  We expect the scale factor to be
        // less than one in "normal" cases (i.e. ku*kv <= (ku+kv)^2 if ku
        // and kv are both positive), so clamping to -1..1 will have
        // no effect on positive kernels.  If there are negative
        // weights, the clamping will just limit the amount of
        // sharpening happening at the corners, and the result will
        // still be smooth.

        // clamp scale factor to -1..1 range
        if (scale >= 1) {
            // scale by 1 (i.e. do nothing)
        }
        else {
            if (scale < -1) {
                // a negative scale means the original kernel had an overall negative weight
                // after making symmetric, the kernel will always be positive
                // scale ku by -1
                // note: choice of u is arbitrary; we could have scaled u or v (but not both)
                for (int i = 0; i < uw; i++) ku[i] *= -1;
                newWeight = -newWeight;
            }
            else {
                // scale ku to restore initialWeight (again, choice of u instead of v is arbitrary)
                for (int i = 0; i < uw; i++) ku[i] *= scale;
                newWeight = initialWeight;
            }
        }
        return newWeight;
    }